

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O2

void __thiscall
cmCTestBuildHandler::LaunchHelper::WriteScrapeMatchers
          (LaunchHelper *this,char *purpose,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *matchers)

{
  pointer pbVar1;
  ostream *poVar2;
  string *m;
  pointer pbVar3;
  string fname;
  cmGeneratedFileStream fout;
  char *local_2b0;
  string local_2a8;
  cmGeneratedFileStream local_288;
  
  if ((matchers->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (matchers->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_2b0 = purpose;
    cmStrCat<std::__cxx11::string&,char_const(&)[8],char_const*&,char_const(&)[5]>
              (&local_2a8,&this->Handler->CTestLaunchDir,(char (*) [8])"/Custom",&local_2b0,
               (char (*) [5])0x77ccda);
    cmGeneratedFileStream::cmGeneratedFileStream(&local_288,&local_2a8,false,None);
    pbVar1 = (matchers->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar3 = (matchers->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1)
    {
      poVar2 = std::operator<<((ostream *)&local_288,(string *)pbVar3);
      std::operator<<(poVar2,"\n");
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&local_288);
    std::__cxx11::string::~string((string *)&local_2a8);
  }
  return;
}

Assistant:

void cmCTestBuildHandler::LaunchHelper::WriteScrapeMatchers(
  const char* purpose, std::vector<std::string> const& matchers)
{
  if (matchers.empty()) {
    return;
  }
  std::string fname =
    cmStrCat(this->Handler->CTestLaunchDir, "/Custom", purpose, ".txt");
  cmGeneratedFileStream fout(fname);
  for (std::string const& m : matchers) {
    fout << m << "\n";
  }
}